

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O2

int Cec_ManChoiceComputation_int(Gia_Man_t *pAig,Cec_ParChc_t *pPars)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  Gia_Man_t *pGVar3;
  abctime aVar4;
  Cec_ManSim_t *p;
  abctime aVar5;
  Gia_Man_t *pGVar6;
  Vec_Int_t *p_00;
  Cec_ManSim_t *in_RCX;
  abctime time;
  char *pStr;
  char *pStr_00;
  char *pStr_01;
  char *pStr_02;
  Vec_Str_t *vStatus;
  abctime local_c8;
  Gia_Man_t *local_c0;
  char *local_b8;
  Vec_Int_t *vOutputs;
  Cec_ManSim_t *local_a8;
  char *local_a0;
  abctime local_98;
  abctime local_90;
  char *local_88;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t ParsSim;
  
  local_98 = Abc_Clock();
  aVar4 = Abc_Clock();
  if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
    free(pAig->pReprs);
    pAig->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (pAig->pNexts != (int *)0x0) {
    free(pAig->pNexts);
    pAig->pNexts = (int *)0x0;
  }
  Gia_ManRandom(1);
  Cec_ManSimSetDefaultParams(&ParsSim);
  ParsSim.nWords = pPars->nWords;
  ParsSim.nFrames = pPars->nRounds;
  ParsSim.fVerbose = pPars->fVerbose;
  ParsSim.fSeqSimulate = 0;
  ParsSim.fLatchCorr = 0;
  p = Cec_ManSimStart(pAig,&ParsSim);
  Cec_ManSimClassesPrepare(p,-1);
  local_a8 = p;
  Cec_ManSimClassesRefine(p);
  pGVar6 = (Gia_Man_t *)&ParsSat;
  Cec_ManSatSetDefaultParams((Cec_ParSat_t *)pGVar6);
  ParsSat.nBTLimit = pPars->nBTLimit;
  ParsSat.fVerbose = pPars->fVerbose;
  if (ParsSat.fVerbose != 0) {
    Abc_Print((int)pGVar6,"Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
              (ulong)(uint)pAig->nObjs,
              (ulong)(uint)(~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs),
              (ulong)(uint)ParsSat.nBTLimit,(ulong)(uint)pPars->fUseRings,pPars->fUseCSat);
    aVar5 = Abc_Clock();
    in_RCX = (Cec_ManSim_t *)(aVar5 - aVar4);
    pGVar6 = pAig;
    Cec_ManRefinedClassPrintStats(pAig,(Vec_Str_t *)0x0,0,(abctime)in_RCX);
  }
  iVar1 = 0;
  pStr_02 = (char *)0x0;
  pStr_00 = (char *)0x0;
  pStr_01 = (char *)0x0;
  local_c0 = pAig;
  do {
    pGVar3 = local_c0;
    if (iVar1 == 1000) {
      Abc_Print((int)pGVar6,"The refinement was not finished. The result may be incorrect.\n");
LAB_004b2eff:
      Cec_ManSimStop(local_a8);
      aVar4 = Abc_Clock();
      if (pPars->fVerbose != 0) {
        pStr = (char *)(aVar4 - local_98);
        Abc_PrintTimeP(0x78f1ae,pStr_00,(abctime)pStr,(abctime)in_RCX);
        Abc_PrintTimeP(0x7191f9,pStr_01,(abctime)pStr,(abctime)in_RCX);
        Abc_PrintTimeP(0x6b5740,pStr_02,(abctime)pStr,(abctime)in_RCX);
        Abc_PrintTimeP(0x70c5c6,pStr + -(long)(pStr_00 + (long)pStr_02 + (long)pStr_01),
                       (abctime)pStr,(abctime)in_RCX);
        Abc_PrintTime(0x6a7560,pStr,time);
      }
      return 0;
    }
    local_b8 = pStr_02;
    local_c8 = Abc_Clock();
    aVar4 = Abc_Clock();
    pGVar6 = Cec_ManCombSpecReduce(pGVar3,&vOutputs,pPars->fUseRings);
    if ((pGVar6->nRegs != 0) ||
       (in_RCX = (Cec_ManSim_t *)pGVar3->vCis,
       pGVar6->vCis->nSize != *(int *)((long)&in_RCX->pAig + 4))) {
      __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecChoice.c"
                    ,0xf5,"int Cec_ManChoiceComputation_int(Gia_Man_t *, Cec_ParChc_t *)");
    }
    aVar5 = Abc_Clock();
    pStr_00 = pStr_00 + (aVar5 - aVar4);
    if (pGVar6->vCos->nSize == 0) {
      if (pPars->fVerbose != 0) {
        aVar4 = Abc_Clock();
        in_RCX = (Cec_ManSim_t *)(aVar4 - local_c8);
        Cec_ManRefinedClassPrintStats(pGVar3,(Vec_Str_t *)0x0,iVar1 + 1,(abctime)in_RCX);
      }
      Vec_IntFree(vOutputs);
      Gia_ManStop(pGVar6);
      pStr_02 = local_b8;
      goto LAB_004b2eff;
    }
    aVar4 = Abc_Clock();
    if (pPars->fUseCSat == 0) {
      p_00 = Cec_ManSatSolveMiter(pGVar6,&ParsSat,&vStatus);
    }
    else {
      in_RCX = (Cec_ManSim_t *)0x0;
      p_00 = Cbs_ManSolveMiterNc(pGVar6,pPars->nBTLimit,&vStatus,0);
    }
    Gia_ManStop(pGVar6);
    aVar5 = Abc_Clock();
    pVVar2 = vStatus;
    pStr_01 = pStr_01 + (aVar5 - aVar4);
    if (p_00->nSize == 0) {
      if (pPars->fVerbose != 0) {
        aVar4 = Abc_Clock();
        in_RCX = (Cec_ManSim_t *)(aVar4 - local_c8);
        Cec_ManRefinedClassPrintStats(local_c0,pVVar2,iVar1 + 1,(abctime)in_RCX);
      }
      Vec_IntFree(p_00);
      Vec_StrFree(vStatus);
      Vec_IntFree(vOutputs);
      pStr_02 = local_b8;
      goto LAB_004b2eff;
    }
    local_a0 = pStr_00;
    local_88 = pStr_01;
    local_90 = Abc_Clock();
    in_RCX = local_a8;
    Cec_ManResimulateCounterExamplesComb(local_a8,p_00);
    Vec_IntFree(p_00);
    aVar4 = Abc_Clock();
    pGVar6 = (Gia_Man_t *)vOutputs;
    pGVar3 = local_c0;
    Gia_ManCheckRefinements(local_c0,vStatus,vOutputs,in_RCX,pPars->fUseRings);
    pVVar2 = vStatus;
    if (pPars->fVerbose != 0) {
      aVar5 = Abc_Clock();
      in_RCX = (Cec_ManSim_t *)(aVar5 - local_c8);
      Cec_ManRefinedClassPrintStats(pGVar3,pVVar2,iVar1 + 1,(abctime)in_RCX);
    }
    pStr_00 = local_a0;
    iVar1 = iVar1 + 1;
    pStr_02 = local_b8 + (aVar4 - local_90);
    Vec_StrFree(vStatus);
    Vec_IntFree((Vec_Int_t *)pGVar6);
    pStr_01 = local_88;
  } while( true );
}

Assistant:

int Cec_ManChoiceComputation_int( Gia_Man_t * pAig, Cec_ParChc_t * pPars )
{
    int nItersMax = 1000;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int r, RetValue;
    abctime clkSat = 0, clkSim = 0, clkSrm = 0, clkTotal = Abc_Clock();
    abctime clk2, clk = Abc_Clock();
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    Gia_ManRandom( 1 );
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr   = 0;
    pParsSim->fSeqSimulate = 0;
    // create equivalence classes of registers
    pSim = Cec_ManSimStart( pAig, pParsSim );
    Cec_ManSimClassesPrepare( pSim, -1 );
    Cec_ManSimClassesRefine( pSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
            Gia_ManObjNum(pAig), Gia_ManAndNum(pAig), pPars->nBTLimit, pPars->fUseRings, pPars->fUseCSat );
        Cec_ManRefinedClassPrintStats( pAig, NULL, 0, Abc_Clock() - clk );
    }
    // perform refinement of equivalence classes
    for ( r = 0; r < nItersMax; r++ )
    { 
        clk = Abc_Clock();
        // perform speculative reduction
        clk2 = Abc_Clock();
        pSrm = Cec_ManCombSpecReduce( pAig, &vOutputs, pPars->fUseRings );
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig) );
        clkSrm += Abc_Clock() - clk2;
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, NULL, r+1, Abc_Clock() - clk );
            Vec_IntFree( vOutputs );
            Gia_ManStop( pSrm );            
            break;
        }
//Gia_DumpAiger( pSrm, "choicesrm", r, 2 );
        // found counter-examples to speculation
        clk2 = Abc_Clock();
        if ( pPars->fUseCSat )
            vCexStore = Cbs_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        Gia_ManStop( pSrm );
        clkSat += Abc_Clock() - clk2;
        if ( Vec_IntSize(vCexStore) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
            Vec_IntFree( vCexStore );
            Vec_StrFree( vStatus );
            Vec_IntFree( vOutputs );
            break;
        }
        // refine classes with these counter-examples
        clk2 = Abc_Clock();
        RetValue = Cec_ManResimulateCounterExamplesComb( pSim, vCexStore );
        Vec_IntFree( vCexStore );
        clkSim += Abc_Clock() - clk2;
        Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
        Vec_StrFree( vStatus );
        Vec_IntFree( vOutputs );
//Gia_ManEquivPrintClasses( pAig, 1, 0 );
    }
    // check the overflow
    if ( r == nItersMax )
        Abc_Print( 1, "The refinement was not finished. The result may be incorrect.\n" );
    Cec_ManSimStop( pSim );
    clkTotal = Abc_Clock() - clkTotal;
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_PrintTimeP( 1, "Srm  ", clkSrm,                        clkTotal );
        Abc_PrintTimeP( 1, "Sat  ", clkSat,                        clkTotal );
        Abc_PrintTimeP( 1, "Sim  ", clkSim,                        clkTotal );
        Abc_PrintTimeP( 1, "Other", clkTotal-clkSat-clkSrm-clkSim, clkTotal );
        Abc_PrintTime( 1, "TOTAL",  clkTotal );
    }
    return 0;
}